

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNot(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int start;
  int length_00;
  int32_t length_01;
  UnicodeString *this_00;
  char16_t *t;
  int32_t length16;
  UChar *s16;
  UnicodeString *string;
  int32_t cpLength;
  int32_t stringsLength;
  int32_t i;
  int32_t rest;
  int32_t pos;
  int32_t length_local;
  UChar *s_local;
  UnicodeSetStringSpan *this_local;
  
  i = 0;
  iVar2 = UVector::size(this->strings);
  stringsLength = length;
  while( true ) {
    iVar3 = UnicodeSet::span(this->pSpanNotSet,s + i,stringsLength,USET_SPAN_NOT_CONTAINED);
    if (iVar3 == stringsLength) {
      return length;
    }
    start = iVar3 + i;
    length_00 = stringsLength - iVar3;
    iVar3 = spanOne(&this->spanSet,s + start,length_00);
    if (0 < iVar3) break;
    for (cpLength = 0; cpLength < iVar2; cpLength = cpLength + 1) {
      if (this->spanLengths[cpLength] != 0xff) {
        this_00 = (UnicodeString *)UVector::elementAt(this->strings,cpLength);
        t = UnicodeString::getBuffer(this_00);
        length_01 = UnicodeString::length(this_00);
        if ((length_01 <= length_00) &&
           (UVar1 = matches16CPB(s,start,length,t,length_01), UVar1 != '\0')) {
          return start;
        }
      }
    }
    i = start - iVar3;
    stringsLength = iVar3 + length_00;
    if (stringsLength == 0) {
      return length;
    }
  }
  return start;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNot(const UChar *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->span(s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOne(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=rest && matches16CPB(s, pos, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}